

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Object * json::Json::createObject(Object *__return_storage_ptr__,Node *O)

{
  Production *pPVar1;
  const_reference RS_00;
  Node *RS;
  Node *O_local;
  Object *object;
  
  Object::Object(__return_storage_ptr__);
  pPVar1 = parser::Node::getProduction(O);
  RS_00 = std::vector<parser::Node,_std::allocator<parser::Node>_>::at(&pPVar1->nodes,1);
  nextRecord(__return_storage_ptr__,RS_00);
  return __return_storage_ptr__;
}

Assistant:

static Object createObject(parser::Node const& O) {
            Object object;
            parser::Node const& RS = O.getProduction().nodes.at(1);
            nextRecord(object, RS);
            return object;
        }